

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::FixedRate::deltaRule(FixedRate *this,Array *var,Array *grad)

{
  float fVar1;
  size_t sVar2;
  float *pfVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  
  sVar2 = var->_M_size;
  if ((deltaRule(std::valarray<float>&,std::valarray<float>const&)::lastVar == '\0') &&
     (iVar4 = __cxa_guard_acquire(&deltaRule(std::valarray<float>&,std::valarray<float>const&)::
                                   lastVar), iVar4 != 0)) {
    deltaRule::lastVar = (Array)ZEXT816(0);
    __cxa_atexit(std::valarray<float>::~valarray,&deltaRule::lastVar,&__dso_handle);
    __cxa_guard_release(&deltaRule(std::valarray<float>&,std::valarray<float>const&)::lastVar);
  }
  if ((this->weightDecay != 0.0) || (NAN(this->weightDecay))) {
    std::valarray<float>::resize(&deltaRule::lastVar,sVar2,0.0);
    std::valarray<float>::operator=(&deltaRule::lastVar,var);
  }
  pfVar3 = grad->_M_data;
  pfVar7 = pfVar3 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar7 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  pfVar6 = var->_M_data;
  pfVar5 = pfVar6 + var->_M_size;
  if (var->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar6 = (float *)0x0;
  }
  internal::scaleAdd<float_const*,float*>(-this->learningRate,pfVar3,pfVar7,pfVar6,pfVar5);
  fVar1 = this->weightDecay;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  pfVar7 = deltaRule::lastVar._M_data + deltaRule::lastVar._M_size;
  pfVar3 = deltaRule::lastVar._M_data;
  if (deltaRule::lastVar._M_size == 0) {
    pfVar7 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  sVar2 = var->_M_size;
  pfVar6 = var->_M_data;
  pfVar5 = pfVar6 + sVar2;
  if (sVar2 == 0) {
    pfVar6 = (float *)0x0;
  }
  if (sVar2 == 0) {
    pfVar5 = (float *)0x0;
  }
  internal::scaleAdd<float*,float*>(fVar1 * this->learningRate * -2.0,pfVar3,pfVar7,pfVar6,pfVar5);
  return;
}

Assistant:

void deltaRule(Array& var, const Array &grad) {
        size_t n = var.size();
        static Array lastVar;
        if (weightDecay != 0) {
            lastVar.resize(n);
            lastVar = var;
        }
        // apply updates: var = var - eta * grad
        internal::scaleAdd(-learningRate,             // - eta
                std::begin(grad), std::end(grad),     // * grad
                std::begin(var), std::end(var));      // + var =: var
        // apply weight decay: var = var - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(lastVar), std::end(lastVar),
                std::begin(var), std::end(var));
        }
    }